

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O1

void display_object_kind_recall(object_kind *kind)

{
  object object;
  object known_obj;
  object local_2b0;
  object local_168;
  
  memcpy(&local_2b0,&DAT_00241d18,0x148);
  memcpy(&local_168,&DAT_00241d18,0x148);
  object_prep(&local_2b0,kind,L'\0',EXTREMIFY);
  if ((kind->aware != false) || (kind->flavor == (flavor *)0x0)) {
    object_copy(&local_168,&local_2b0);
  }
  local_2b0.known = &local_168;
  display_object_recall(&local_2b0);
  object_wipe(&local_168);
  object_wipe(&local_2b0);
  return;
}

Assistant:

void display_object_kind_recall(struct object_kind *kind)
{
	struct object object = OBJECT_NULL, known_obj = OBJECT_NULL;
	object_prep(&object, kind, 0, EXTREMIFY);
	if (kind->aware || !kind->flavor) {
		object_copy(&known_obj, &object);
	}
	object.known = &known_obj;

	display_object_recall(&object);
	object_wipe(&known_obj);
	object_wipe(&object);
}